

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidget::setGraphicsEffect(QWidget *this,QGraphicsEffect *effect)

{
  long lVar1;
  QWidgetPrivate *pQVar2;
  QWidget *widget;
  QGraphicsEffect *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QGraphicsEffectSource *source;
  QGraphicsEffectSourcePrivate *sourced;
  QWidgetPrivate *d;
  QWidgetEffectSourcePrivate *in_stack_ffffffffffffffa0;
  QWidgetPrivate *in_stack_ffffffffffffffa8;
  QGraphicsEffectPrivate *in_stack_ffffffffffffffb0;
  QWidgetPrivate *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QWidget *)0x36fb2f);
  if (pQVar2->graphicsEffect != in_RSI) {
    if (pQVar2->graphicsEffect != (QGraphicsEffect *)0x0) {
      in_stack_ffffffffffffffa8 = pQVar2;
      rect(in_RDI);
      QWidgetPrivate::invalidateBackingStore<QRect>(in_stack_ffffffffffffffc0,(QRect *)in_RDI);
      in_stack_ffffffffffffffb0 = (QGraphicsEffectPrivate *)pQVar2->graphicsEffect;
      if (in_stack_ffffffffffffffb0 != (QGraphicsEffectPrivate *)0x0) {
        (**(code **)(*(long *)in_stack_ffffffffffffffb0 + 0x20))();
      }
      pQVar2->graphicsEffect = (QGraphicsEffect *)0x0;
    }
    if (in_RSI != (QGraphicsEffect *)0x0) {
      widget = (QWidget *)operator_new(0xf8);
      QWidgetEffectSourcePrivate::QWidgetEffectSourcePrivate(in_stack_ffffffffffffffa0,widget);
      in_stack_ffffffffffffffc0 = (QWidgetPrivate *)operator_new(0x10);
      QGraphicsEffectSource::QGraphicsEffectSource
                ((QGraphicsEffectSource *)in_stack_ffffffffffffffb0,
                 (QGraphicsEffectSourcePrivate *)in_stack_ffffffffffffffa8,
                 (QObject *)in_stack_ffffffffffffffc0);
      pQVar2->graphicsEffect = in_RSI;
      QGraphicsEffect::d_func((QGraphicsEffect *)0x36fc2f);
      QGraphicsEffectPrivate::setGraphicsEffectSource
                (in_stack_ffffffffffffffb0,(QGraphicsEffectSource *)in_stack_ffffffffffffffa8);
      update(widget);
    }
    QWidgetPrivate::updateIsOpaque(in_stack_ffffffffffffffc0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidget::setGraphicsEffect(QGraphicsEffect *effect)
{
    Q_D(QWidget);
    if (d->graphicsEffect == effect)
        return;

    if (d->graphicsEffect) {
        d->invalidateBackingStore(rect());
        delete d->graphicsEffect;
        d->graphicsEffect = nullptr;
    }

    if (effect) {
        // Set new effect.
        QGraphicsEffectSourcePrivate *sourced = new QWidgetEffectSourcePrivate(this);
        QGraphicsEffectSource *source = new QGraphicsEffectSource(*sourced);
        d->graphicsEffect = effect;
        effect->d_func()->setGraphicsEffectSource(source);
        update();
    }

    d->updateIsOpaque();
}